

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  StringPiece s1_03;
  StringPiece s1_04;
  StringPiece s1_05;
  StringPiece s1_06;
  StringPiece s1_07;
  StringPiece s1_08;
  bool bVar1;
  LogMessage *pLVar2;
  bool local_1d2;
  bool local_1d1;
  StringPiece local_1b8;
  bool *local_1a8;
  char *local_1a0;
  StringPiece local_198;
  bool *local_188;
  char *local_180;
  StringPiece local_178;
  bool *local_168;
  char *local_160;
  StringPiece local_158;
  bool *local_148;
  char *local_140;
  StringPiece local_138;
  bool *local_128;
  char *local_120;
  StringPiece local_118;
  bool *local_108;
  char *local_100;
  StringPiece local_f8;
  bool *local_e8;
  char *local_e0;
  StringPiece local_d8;
  bool *local_c8;
  char *local_c0;
  StringPiece local_b8;
  bool *local_a8;
  char *local_a0;
  StringPiece local_98;
  bool *local_88;
  char *local_80;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  undefined1 *local_28;
  bool *value_local;
  StringPiece str_local;
  
  local_28 = (undefined1 *)str.length_;
  str_local.ptr_ = str.ptr_;
  local_61 = 0;
  value_local = (bool *)this;
  if (local_28 == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x529);
    local_61 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: value != NULL: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"NULL output boolean given.");
    internal::LogFinisher::operator=(local_75,pLVar2);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_88 = value_local;
  local_80 = str_local.ptr_;
  StringPiece::StringPiece(&local_98,"true");
  s1_08.length_ = (stringpiece_ssize_type)local_80;
  s1_08.ptr_ = local_88;
  bVar1 = CaseEqual(s1_08,local_98);
  local_1d1 = true;
  if (!bVar1) {
    local_a8 = value_local;
    local_a0 = str_local.ptr_;
    StringPiece::StringPiece(&local_b8,"t");
    s1_07.length_ = (stringpiece_ssize_type)local_a0;
    s1_07.ptr_ = local_a8;
    bVar1 = CaseEqual(s1_07,local_b8);
    local_1d1 = true;
    if (!bVar1) {
      local_c8 = value_local;
      local_c0 = str_local.ptr_;
      StringPiece::StringPiece(&local_d8,"yes");
      s1_06.length_ = (stringpiece_ssize_type)local_c0;
      s1_06.ptr_ = local_c8;
      bVar1 = CaseEqual(s1_06,local_d8);
      local_1d1 = true;
      if (!bVar1) {
        local_e8 = value_local;
        local_e0 = str_local.ptr_;
        StringPiece::StringPiece(&local_f8,"y");
        s1_05.length_ = (stringpiece_ssize_type)local_e0;
        s1_05.ptr_ = local_e8;
        bVar1 = CaseEqual(s1_05,local_f8);
        local_1d1 = true;
        if (!bVar1) {
          local_108 = value_local;
          local_100 = str_local.ptr_;
          StringPiece::StringPiece(&local_118,"1");
          s1_04.length_ = (stringpiece_ssize_type)local_100;
          s1_04.ptr_ = local_108;
          local_1d1 = CaseEqual(s1_04,local_118);
        }
      }
    }
  }
  if (local_1d1 == false) {
    local_128 = value_local;
    local_120 = str_local.ptr_;
    StringPiece::StringPiece(&local_138,"false");
    s1_03.length_ = (stringpiece_ssize_type)local_120;
    s1_03.ptr_ = local_128;
    bVar1 = CaseEqual(s1_03,local_138);
    local_1d2 = true;
    if (!bVar1) {
      local_148 = value_local;
      local_140 = str_local.ptr_;
      StringPiece::StringPiece(&local_158,"f");
      s1_02.length_ = (stringpiece_ssize_type)local_140;
      s1_02.ptr_ = local_148;
      bVar1 = CaseEqual(s1_02,local_158);
      local_1d2 = true;
      if (!bVar1) {
        local_168 = value_local;
        local_160 = str_local.ptr_;
        StringPiece::StringPiece(&local_178,"no");
        s1_01.length_ = (stringpiece_ssize_type)local_160;
        s1_01.ptr_ = local_168;
        bVar1 = CaseEqual(s1_01,local_178);
        local_1d2 = true;
        if (!bVar1) {
          local_188 = value_local;
          local_180 = str_local.ptr_;
          StringPiece::StringPiece(&local_198,"n");
          s1_00.length_ = (stringpiece_ssize_type)local_180;
          s1_00.ptr_ = local_188;
          bVar1 = CaseEqual(s1_00,local_198);
          local_1d2 = true;
          if (!bVar1) {
            local_1a8 = value_local;
            local_1a0 = str_local.ptr_;
            StringPiece::StringPiece(&local_1b8,"0");
            s1.length_ = (stringpiece_ssize_type)local_1a0;
            s1.ptr_ = local_1a8;
            local_1d2 = CaseEqual(s1,local_1b8);
          }
        }
      }
    }
    if (local_1d2 == false) {
      str_local.length_._7_1_ = false;
    }
    else {
      *local_28 = 0;
      str_local.length_._7_1_ = true;
    }
  }
  else {
    *local_28 = 1;
    str_local.length_._7_1_ = true;
  }
  return str_local.length_._7_1_;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != NULL) << "NULL output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}